

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_>::
Data(Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_> *this,
    Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  QSize QVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  QTileRules QVar8;
  Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *pNVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  R RVar13;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar11 = other->numBuckets;
  sVar12 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar12;
  this->spans = (Span *)0x0;
  RVar13 = allocateSpans(sVar11);
  this->spans = (Span *)RVar13.spans;
  if (RVar13.nSpans != 0) {
    lVar10 = 0;
    sVar11 = 0;
    do {
      pSVar2 = other->spans;
      sVar12 = 0;
      do {
        bVar1 = pSVar2->offsets[sVar12 + lVar10];
        if (bVar1 != 0xff) {
          pEVar3 = pSVar2[sVar11].entries;
          pNVar9 = Span<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_>
                   ::insert(this->spans + sVar11,sVar12);
          pNVar9->key = *(ControlDescriptor *)pEVar3[bVar1].storage.data;
          pDVar4 = *(Data **)(pEVar3[bVar1].storage.data + 8);
          (pNVar9->value).fileName.d.d = pDVar4;
          (pNVar9->value).fileName.d.ptr = *(char16_t **)(pEVar3[bVar1].storage.data + 0x10);
          (pNVar9->value).fileName.d.size = *(qsizetype *)(pEVar3[bVar1].storage.data + 0x18);
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1)
            ;
            UNLOCK();
          }
          QVar5 = *(QSize *)(pEVar3[bVar1].storage.data + 0x20);
          uVar6 = *(undefined8 *)(pEVar3[bVar1].storage.data + 0x28);
          uVar7 = *(undefined8 *)(pEVar3[bVar1].storage.data + 0x30);
          QVar8 = *(QTileRules *)(pEVar3[bVar1].storage.data + 0x38);
          (pNVar9->value).margins.m_right = (Representation)(int)uVar7;
          (pNVar9->value).margins.m_bottom = (Representation)(int)((ulong)uVar7 >> 0x20);
          (pNVar9->value).tileRules = QVar8;
          (pNVar9->value).size = QVar5;
          (pNVar9->value).margins.m_left = (Representation)(int)uVar6;
          (pNVar9->value).margins.m_top = (Representation)(int)((ulong)uVar6 >> 0x20);
        }
        sVar12 = sVar12 + 1;
      } while (sVar12 != 0x80);
      sVar11 = sVar11 + 1;
      lVar10 = lVar10 + 0x90;
    } while (sVar11 != RVar13.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }